

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TabItemLabelAndCloseButton
               (ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,ImVec2 frame_padding,
               char *label,ImGuiID tab_id,ImGuiID close_button_id,bool is_contents_visible,
               bool *out_just_closed,bool *out_text_clipped)

{
  float *lhs;
  ImGuiContext_conflict *pIVar1;
  bool bVar2;
  ImU32 col;
  float fVar3;
  float fVar4;
  ImVec2 IVar5;
  float local_12c;
  float local_128;
  float local_124;
  bool local_fd;
  float local_f8;
  float ellipsis_max_x;
  ImVec2 local_ec;
  ImVec2 local_e4;
  ImVec2 local_dc;
  ImVec2 local_d4;
  undefined1 local_cc [8];
  ImRect bullet_bb;
  ImGuiLastItemData last_item_backup;
  bool unsaved_marker_visible;
  bool close_button_visible;
  bool close_button_pressed;
  ImVec2 button_pos;
  float button_sz;
  ImRect text_ellipsis_clip_bb;
  ImRect text_pixel_clip_bb;
  ImVec2 label_size;
  ImGuiContext *g;
  bool is_contents_visible_local;
  ImGuiID close_button_id_local;
  ImGuiID tab_id_local;
  char *label_local;
  ImGuiTabItemFlags flags_local;
  ImRect *bb_local;
  ImDrawList *draw_list_local;
  ImVec2 frame_padding_local;
  
  pIVar1 = GImGui;
  draw_list_local = (ImDrawList *)frame_padding;
  text_pixel_clip_bb.Max = CalcTextSize(label,(char *)0x0,true,-1.0);
  if (out_just_closed != (bool *)0x0) {
    *out_just_closed = false;
  }
  if (out_text_clipped != (bool *)0x0) {
    *out_text_clipped = false;
  }
  fVar3 = ImRect::GetWidth(bb);
  if (fVar3 <= 1.0) {
    return;
  }
  ImRect::ImRect((ImRect *)&text_ellipsis_clip_bb.Max,(bb->Min).x + draw_list_local._0_4_,
                 (bb->Min).y + draw_list_local._4_4_,(bb->Max).x - draw_list_local._0_4_,(bb->Max).y
                );
  stack0xffffffffffffff90 = text_ellipsis_clip_bb.Max;
  IVar5 = stack0xffffffffffffff90;
  text_ellipsis_clip_bb.Min.y = text_pixel_clip_bb.Min.y;
  text_ellipsis_clip_bb.Min.x = text_pixel_clip_bb.Min.x;
  if (out_text_clipped != (bool *)0x0) {
    button_pos.y = text_ellipsis_clip_bb.Max.x;
    *out_text_clipped = text_pixel_clip_bb.Min.x < button_pos.y + text_pixel_clip_bb.Max.x;
  }
  button_pos.x = pIVar1->FontSize;
  unique0x10000509 = IVar5;
  fVar3 = ImMax<float>((bb->Min).x,
                       (-draw_list_local._0_4_ + -draw_list_local._0_4_ + (bb->Max).x) -
                       button_pos.x);
  ImVec2::ImVec2((ImVec2 *)&last_item_backup.DisplayRect.Max.y,fVar3,(bb->Min).y);
  last_item_backup.DisplayRect.Max.x._3_1_ = 0;
  last_item_backup.DisplayRect.Max.x._2_1_ = 0;
  if (close_button_id != 0) {
    if (!is_contents_visible) {
      fVar3 = ImRect::GetWidth(bb);
      fVar4 = ImMax<float>(button_pos.x,(pIVar1->Style).TabMinWidthForCloseButton);
      if (fVar3 < fVar4) goto LAB_0028e875;
    }
    if ((((pIVar1->HoveredId == tab_id) || (pIVar1->HoveredId == close_button_id)) ||
        (pIVar1->ActiveId == tab_id)) || (pIVar1->ActiveId == close_button_id)) {
      last_item_backup.DisplayRect.Max.x._2_1_ = 1;
    }
  }
LAB_0028e875:
  local_fd = false;
  if ((flags & 1U) != 0) {
    local_fd = last_item_backup.DisplayRect.Max.y + button_pos.x <= (bb->Max).x;
  }
  last_item_backup.DisplayRect.Max.x._1_1_ = local_fd;
  if ((last_item_backup.DisplayRect.Max.x._2_1_ & 1) == 0) {
    if (local_fd != false) {
      ImVec2::ImVec2(&local_e4,button_pos.x,button_pos.x);
      lhs = &last_item_backup.DisplayRect.Max.y;
      local_dc = operator+((ImVec2 *)lhs,&local_e4);
      local_ec = operator*(&(pIVar1->Style).FramePadding,2.0);
      local_d4 = operator+(&local_dc,&local_ec);
      ImRect::ImRect((ImRect *)local_cc,(ImVec2 *)lhs,&local_d4);
      IVar5 = ImRect::GetCenter((ImRect *)local_cc);
      col = GetColorU32(0,1.0);
      RenderBullet(draw_list,IVar5,col);
    }
  }
  else {
    memcpy(&bullet_bb.Max,&pIVar1->LastItemData,0x3c);
    PushStyleVar(0xb,(ImVec2 *)&draw_list_local);
    bVar2 = CloseButton(close_button_id,(ImVec2 *)&last_item_backup.DisplayRect.Max.y);
    if (bVar2) {
      last_item_backup.DisplayRect.Max.x._3_1_ = 1;
    }
    PopStyleVar(1);
    memcpy(&pIVar1->LastItemData,&bullet_bb.Max,0x3c);
    if (((flags & 4U) == 0) && (bVar2 = IsMouseClicked(2,false), bVar2)) {
      last_item_backup.DisplayRect.Max.x._3_1_ = 1;
    }
  }
  if ((last_item_backup.DisplayRect.Max.x._2_1_ & 1) == 0) {
    local_124 = (bb->Max).x - 1.0;
  }
  else {
    local_124 = text_pixel_clip_bb.Min.x;
  }
  local_f8 = local_124;
  if (((last_item_backup.DisplayRect.Max.x._2_1_ & 1) != 0) ||
     ((last_item_backup.DisplayRect.Max.x._1_1_ & 1) != 0)) {
    if ((last_item_backup.DisplayRect.Max.x._2_1_ & 1) == 0) {
      local_128 = button_pos.x * 0.8;
    }
    else {
      local_128 = button_pos.x;
    }
    local_f8 = text_pixel_clip_bb.Min.x - local_128;
    if ((last_item_backup.DisplayRect.Max.x._1_1_ & 1) == 0) {
      local_12c = 0.0;
    }
    else {
      local_12c = button_pos.x * 0.8;
    }
    text_ellipsis_clip_bb.Min.x = text_ellipsis_clip_bb.Min.x - local_12c;
    text_pixel_clip_bb.Min.x = local_f8;
  }
  RenderTextEllipsis(draw_list,(ImVec2 *)&button_pos.y,&text_ellipsis_clip_bb.Min,
                     text_pixel_clip_bb.Min.x,local_f8,label,(char *)0x0,&text_pixel_clip_bb.Max);
  if (out_just_closed != (bool *)0x0) {
    *out_just_closed = (bool)(last_item_backup.DisplayRect.Max.x._3_1_ & 1);
  }
  return;
}

Assistant:

void ImGui::TabItemLabelAndCloseButton(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, ImVec2 frame_padding, const char* label, ImGuiID tab_id, ImGuiID close_button_id, bool is_contents_visible, bool* out_just_closed, bool* out_text_clipped)
{
    ImGuiContext& g = *GImGui;
    ImVec2 label_size = CalcTextSize(label, NULL, true);

    if (out_just_closed)
        *out_just_closed = false;
    if (out_text_clipped)
        *out_text_clipped = false;

    if (bb.GetWidth() <= 1.0f)
        return;

    // In Style V2 we'll have full override of all colors per state (e.g. focused, selected)
    // But right now if you want to alter text color of tabs this is what you need to do.
#if 0
    const float backup_alpha = g.Style.Alpha;
    if (!is_contents_visible)
        g.Style.Alpha *= 0.7f;
#endif

    // Render text label (with clipping + alpha gradient) + unsaved marker
    ImRect text_pixel_clip_bb(bb.Min.x + frame_padding.x, bb.Min.y + frame_padding.y, bb.Max.x - frame_padding.x, bb.Max.y);
    ImRect text_ellipsis_clip_bb = text_pixel_clip_bb;

    // Return clipped state ignoring the close button
    if (out_text_clipped)
    {
        *out_text_clipped = (text_ellipsis_clip_bb.Min.x + label_size.x) > text_pixel_clip_bb.Max.x;
        //draw_list->AddCircle(text_ellipsis_clip_bb.Min, 3.0f, *out_text_clipped ? IM_COL32(255, 0, 0, 255) : IM_COL32(0, 255, 0, 255));
    }

    const float button_sz = g.FontSize;
    const ImVec2 button_pos(ImMax(bb.Min.x, bb.Max.x - frame_padding.x * 2.0f - button_sz), bb.Min.y);

    // Close Button & Unsaved Marker
    // We are relying on a subtle and confusing distinction between 'hovered' and 'g.HoveredId' which happens because we are using ImGuiButtonFlags_AllowOverlapMode + SetItemAllowOverlap()
    //  'hovered' will be true when hovering the Tab but NOT when hovering the close button
    //  'g.HoveredId==id' will be true when hovering the Tab including when hovering the close button
    //  'g.ActiveId==close_button_id' will be true when we are holding on the close button, in which case both hovered booleans are false
    bool close_button_pressed = false;
    bool close_button_visible = false;
    if (close_button_id != 0)
        if (is_contents_visible || bb.GetWidth() >= ImMax(button_sz, g.Style.TabMinWidthForCloseButton))
            if (g.HoveredId == tab_id || g.HoveredId == close_button_id || g.ActiveId == tab_id || g.ActiveId == close_button_id)
                close_button_visible = true;
    bool unsaved_marker_visible = (flags & ImGuiTabItemFlags_UnsavedDocument) != 0 && (button_pos.x + button_sz <= bb.Max.x);

    if (close_button_visible)
    {
        ImGuiLastItemData last_item_backup = g.LastItemData;
        PushStyleVar(ImGuiStyleVar_FramePadding, frame_padding);
        if (CloseButton(close_button_id, button_pos))
            close_button_pressed = true;
        PopStyleVar();
        g.LastItemData = last_item_backup;

        // Close with middle mouse button
        if (!(flags & ImGuiTabItemFlags_NoCloseWithMiddleMouseButton) && IsMouseClicked(2))
            close_button_pressed = true;
    }
    else if (unsaved_marker_visible)
    {
        const ImRect bullet_bb(button_pos, button_pos + ImVec2(button_sz, button_sz) + g.Style.FramePadding * 2.0f);
        RenderBullet(draw_list, bullet_bb.GetCenter(), GetColorU32(ImGuiCol_Text));
    }

    // This is all rather complicated
    // (the main idea is that because the close button only appears on hover, we don't want it to alter the ellipsis position)
    // FIXME: if FramePadding is noticeably large, ellipsis_max_x will be wrong here (e.g. #3497), maybe for consistency that parameter of RenderTextEllipsis() shouldn't exist..
    float ellipsis_max_x = close_button_visible ? text_pixel_clip_bb.Max.x : bb.Max.x - 1.0f;
    if (close_button_visible || unsaved_marker_visible)
    {
        text_pixel_clip_bb.Max.x -= close_button_visible ? (button_sz) : (button_sz * 0.80f);
        text_ellipsis_clip_bb.Max.x -= unsaved_marker_visible ? (button_sz * 0.80f) : 0.0f;
        ellipsis_max_x = text_pixel_clip_bb.Max.x;
    }
    RenderTextEllipsis(draw_list, text_ellipsis_clip_bb.Min, text_ellipsis_clip_bb.Max, text_pixel_clip_bb.Max.x, ellipsis_max_x, label, NULL, &label_size);

#if 0
    if (!is_contents_visible)
        g.Style.Alpha = backup_alpha;
#endif

    if (out_just_closed)
        *out_just_closed = close_button_pressed;
}